

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

void uv__udp_io(uv_loop_t *loop,uv__io_t *w,uint revents)

{
  uint *handle;
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int *piVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ssize_t sVar9;
  long lVar10;
  ulong uVar11;
  ssize_t sVar12;
  sockaddr_storage peer;
  iovec iov [20];
  uv__mmsghdr msgs [20];
  sockaddr_in6 peers [20];
  uv_buf_t local_998;
  uint local_988;
  int local_984;
  long local_980;
  long local_978;
  uv_buf_t local_970;
  msghdr local_960;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  uint auStack_8b0 [2];
  long local_8a8 [39];
  undefined4 local_770 [2];
  uv__mmsghdr local_768 [20];
  undefined1 local_268 [568];
  
  if (*(int *)&w[-2].cb != 0xf) {
    __assert_fail("handle->type == UV_UDP",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xac,"void uv__udp_io(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  handle = &w[-3].pevents;
  if ((revents & 1) == 0) {
LAB_0018a30a:
    if ((revents & 4) != 0) {
      uv__udp_sendmsg((uv_udp_t *)handle);
      uv__udp_run_completed((uv_udp_t *)handle);
    }
    return;
  }
  if (*(long *)&w[-1].fd == 0) {
    __assert_fail("handle->recv_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xf6,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  lVar10._0_4_ = w[-1].pevents;
  lVar10._4_4_ = w[-1].events;
  if (lVar10 == 0) {
    __assert_fail("handle->alloc_cb != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/src/unix/udp.c"
                  ,0xf7,"void uv__udp_recvmsg(uv_udp_t *)");
  }
  iVar6 = 0x20;
  local_988 = revents;
LAB_00189fc4:
  local_998 = uv_buf_init((char *)0x0,0);
  (**(code **)&w[-1].pevents)(handle,0x10000,&local_998);
  if ((local_998.base != (char *)0x0) && (local_998.len != 0)) {
    uv_once(&once,uv__udp_mmsg_init);
    if ((0x1ffff < local_998.len & uv__recvmmsg_avail) == 1) {
      uVar11 = local_998.len >> 0x10;
      if (0x13 < uVar11) {
        uVar11 = 0x14;
      }
      puVar5 = local_268;
      uVar8 = 0;
      pcVar3 = local_998.base;
      do {
        *(long *)((long)local_8a8 + uVar8) = (long)pcVar3;
        *(undefined8 *)((long)local_8a8 + uVar8 + 8) = 0x10000;
        *(long **)((long)&local_768[0].msg_hdr.msg_iov + uVar8 * 4) =
             (long *)((long)local_8a8 + uVar8);
        *(undefined8 *)((long)&local_768[0].msg_hdr.msg_iovlen + uVar8 * 4) = 1;
        *(undefined1 **)((long)&local_768[0].msg_hdr.msg_name + uVar8 * 4) = puVar5;
        (&local_768[0].msg_hdr.msg_namelen)[uVar8] = 0x1c;
        uVar8 = uVar8 + 0x10;
        puVar5 = puVar5 + 0x1c;
        pcVar3 = pcVar3 + 0x10000;
      } while ((uint)uVar11 << 4 != uVar8);
      local_984 = iVar6;
      do {
        uVar2 = uv__recvmmsg(w->fd,local_768,(uint)uVar11,0,(timespec *)0x0);
        if (uVar2 != 0xffffffff) {
          if (0 < (int)uVar2) {
            lVar10 = (ulong)uVar2 * 0x10;
            local_980 = lVar10 + -8;
            lVar7 = 0;
            local_978 = lVar10;
            goto LAB_0018a1e0;
          }
          if (uVar2 == 0) goto LAB_0018a0e0;
          piVar4 = __errno_location();
          iVar6 = *piVar4;
          break;
        }
        piVar4 = __errno_location();
        iVar6 = *piVar4;
      } while (iVar6 == 4);
      if (iVar6 == 0xb) {
LAB_0018a0e0:
        lVar10 = 0;
      }
      else {
        lVar10 = (long)-iVar6;
      }
      (**(code **)&w[-1].fd)(handle,lVar10,&local_998);
      goto LAB_0018a29b;
    }
    local_960.msg_controllen = 0;
    local_960.msg_flags = 0;
    local_960._52_4_ = 0;
    local_960.msg_control = (void *)0x0;
    local_8b8 = 0;
    auStack_8b0[0] = 0;
    auStack_8b0[1] = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    local_8d8 = 0;
    uStack_8d0 = 0;
    local_8e8 = 0;
    uStack_8e0 = 0;
    local_8f8 = 0;
    uStack_8f0 = 0;
    local_908 = 0;
    uStack_900 = 0;
    local_918 = 0;
    uStack_910 = 0;
    local_928 = 0;
    uStack_920 = 0;
    local_960.msg_name = &local_928;
    local_960.msg_namelen = 0x80;
    local_960._12_4_ = 0;
    local_960.msg_iovlen = 1;
    local_960.msg_iov = (iovec *)&local_998;
    do {
      sVar12 = recvmsg(w->fd,&local_960,0);
      sVar9 = sVar12;
      if (sVar12 != -1) goto LAB_0018a27d;
      piVar4 = __errno_location();
      iVar1 = *piVar4;
    } while ((long)iVar1 == 4);
    if (iVar1 == 0xb) {
      sVar9 = 0;
    }
    else {
      sVar9 = -(long)iVar1;
    }
LAB_0018a27d:
    (**(code **)&w[-1].fd)(handle,sVar9,&local_998);
    iVar6 = iVar6 + -1;
    goto LAB_0018a2c0;
  }
  (**(code **)&w[-1].fd)(handle,0xffffffffffffff97,&local_998,0,0);
  goto LAB_0018a30a;
  while( true ) {
    local_970 = uv_buf_init(*(char **)((long)&local_8b8 + lVar7 + lVar10),
                            *(uint *)((long)auStack_8b0 + lVar7 + lVar10));
    (**(code **)&w[-1].fd)(handle,local_770[(ulong)uVar2 * 0x10 + lVar7],&local_970);
    lVar7 = lVar7 + -0x10;
    if (local_978 + lVar7 == 0) break;
LAB_0018a1e0:
    if (*(long *)&w[-1].fd == 0) break;
  }
LAB_0018a29b:
  sVar12 = (ssize_t)(int)uVar2;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  iVar6 = local_984 - uVar2;
  revents = local_988;
LAB_0018a2c0:
  if ((((sVar12 == -1) || (iVar6 < 1)) || (w->fd == -1)) || (*(long *)&w[-1].fd == 0))
  goto LAB_0018a30a;
  goto LAB_00189fc4;
}

Assistant:

static void uv__udp_io(uv_loop_t* loop, uv__io_t* w, unsigned int revents) {
  uv_udp_t* handle;

  handle = container_of(w, uv_udp_t, io_watcher);
  assert(handle->type == UV_UDP);

  if (revents & POLLIN)
    uv__udp_recvmsg(handle);

  if (revents & POLLOUT) {
    uv__udp_sendmsg(handle);
    uv__udp_run_completed(handle);
  }
}